

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O0

void __thiscall CapabilitiesToStateMask::setOpacityPixmapMask(CapabilitiesToStateMask *this)

{
  long in_RDI;
  
  updateStateBits((uint *)(in_RDI + 0x14),1,true);
  updateStateBits((uint *)(in_RDI + 0x14),2,false);
  updateStateBits((uint *)(in_RDI + 0x14),0x10,true);
  updateStateBits((uint *)(in_RDI + 0x14),0x20,true);
  updateStateBits((uint *)(in_RDI + 0x14),0x100,true);
  updateStateBits((uint *)(in_RDI + 0x14),0x1000,true);
  updateStateBits((uint *)(in_RDI + 0x14),0x2000,true);
  updateStateBits((uint *)(in_RDI + 0x14),0x4000,false);
  updateStateBits((uint *)(in_RDI + 0x14),0x10000,false);
  updateStateBits((uint *)(in_RDI + 0x14),0x20000,false);
  return;
}

Assistant:

void setOpacityPixmapMask() {
        updateStateBits(&opacityPixmapMask, STATE_XFORM_SCALE, true);
        updateStateBits(&opacityPixmapMask, STATE_XFORM_COMPLEX, false);

        updateStateBits(&opacityPixmapMask, STATE_BRUSH_PATTERN, true);
        updateStateBits(&opacityPixmapMask, STATE_BRUSH_ALPHA, true);

        updateStateBits(&opacityPixmapMask, STATE_PEN_ENABLED, true);

        updateStateBits(&opacityPixmapMask, STATE_ANTIALIASING, true);
        updateStateBits(&opacityPixmapMask, STATE_ALPHA, true);
        updateStateBits(&opacityPixmapMask, STATE_BLENDING_COMPLEX, false);

        updateStateBits(&opacityPixmapMask, STATE_CLIPSYS_COMPLEX, false);
        updateStateBits(&opacityPixmapMask, STATE_CLIP_COMPLEX, false);
    }